

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::Clara::addOptName(Arg *arg,string *optName)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  logic_error *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  value_type local_140;
  allocator local_119;
  string local_118;
  string local_f8 [39];
  undefined1 local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator local_39;
  string local_38;
  string *local_18;
  string *optName_local;
  Arg *arg_local;
  
  local_18 = optName;
  optName_local = (string *)arg;
  uVar3 = std::__cxx11::string::empty();
  psVar1 = local_18;
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"--",&local_39);
    bVar2 = Detail::startsWith(psVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    psVar1 = local_18;
    if (bVar2) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        local_d1 = 1;
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_d0,"Only one long opt may be specified. \'",optName_local + 4);
        std::operator+(&local_b0,&local_d0,"\' already specified, now attempting to add \'");
        std::operator+(&local_90,&local_b0,local_18);
        std::operator+(&local_70,&local_90,"\'");
        std::logic_error::logic_error(plVar4,(string *)&local_70);
        local_d1 = 0;
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::__cxx11::string::substr((ulong)local_f8,(ulong)local_18);
      std::__cxx11::string::operator=((string *)(optName_local + 4),local_f8);
      std::__cxx11::string::~string(local_f8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_118,"-",&local_119);
      bVar2 = Detail::startsWith(psVar1,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      if (!bVar2) {
        plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_180,"option must begin with - or --. Option was: \'",local_18);
        std::operator+(&local_160,&local_180,"\'");
        std::logic_error::logic_error(plVar4,(string *)&local_160);
        __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      psVar1 = optName_local + 3;
      std::__cxx11::string::substr((ulong)&local_140,(ulong)local_18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&psVar1->_M_string_length,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
    }
  }
  return;
}

Assistant:

void addOptName( Arg& arg, std::string const& optName )
        {
            if( optName.empty() )
                return;
            if( Detail::startsWith( optName, "--" ) ) {
                if( !arg.longName.empty() )
                    throw std::logic_error( "Only one long opt may be specified. '"
                        + arg.longName
                        + "' already specified, now attempting to add '"
                        + optName + "'" );
                arg.longName = optName.substr( 2 );
            }
            else if( Detail::startsWith( optName, "-" ) )
                arg.shortNames.push_back( optName.substr( 1 ) );
            else
                throw std::logic_error( "option must begin with - or --. Option was: '" + optName + "'" );
        }